

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeH1.cpp
# Opt level: O3

void TPZShapeH1<pzshape::TPZShapeQuad>::Shape(TPZVec<double> *pt,TPZShapeData *data)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  bool bVar6;
  int64_t size;
  int nod;
  long lVar7;
  long lVar8;
  TPZTransform<double> *this;
  int side;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  TPZFNMatrix<1,_double> auxmat;
  TPZManVector<double,_3> outvec;
  TPZFNMatrix<18,_double> phiblend;
  TPZFNMatrix<18,_double> dphiblend;
  TPZFMatrix<double> local_1238;
  double adStack_11a8 [2];
  TPZManVector<double,_3> local_1198;
  TPZFMatrix<double> local_1160;
  double local_10d0 [19];
  TPZFMatrix<double> local_1038;
  double local_fa8 [19];
  TPZFMatrix<double> local_f10;
  double adStack_e80 [101];
  TPZFMatrix<double> local_b58;
  double adStack_ac8 [101];
  TPZFMatrix<double> local_7a0;
  double adStack_710 [101];
  TPZFMatrix<double> local_3e8;
  double adStack_358 [101];
  
  pzshape::TPZShapeQuad::ShapeCorner
            (pt,&(data->fPhi).super_TPZFMatrix<double>,&(data->fDPhi).super_TPZFMatrix<double>);
  if ((data->fPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow != 4) {
    local_1160.fElem = local_10d0;
    local_1160.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 9;
    local_1160.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
    local_1160.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_1160.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_1160.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_018863a0;
    local_1160.fSize = 0x12;
    local_1160.fGiven = local_1160.fElem;
    TPZVec<int>::TPZVec(&local_1160.fPivot.super_TPZVec<int>,0);
    local_1160.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
    local_1160.fPivot.super_TPZVec<int>.fStore = local_1160.fPivot.fExtAlloc;
    local_1160.fPivot.super_TPZVec<int>.fNElements = 0;
    local_1160.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_1160.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
    local_1160.fWork.fStore = (double *)0x0;
    local_1160.fWork.fNElements = 0;
    local_1160.fWork.fNAlloc = 0;
    local_1160.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFNMatrix_018860b0;
    local_1038.fElem = local_fa8;
    local_1038.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 2;
    local_1038.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 9;
    local_1038.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_1038.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_1038.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_018863a0;
    local_1038.fSize = 0x12;
    local_1038.fGiven = local_1038.fElem;
    TPZVec<int>::TPZVec(&local_1038.fPivot.super_TPZVec<int>,0);
    local_1038.fPivot.super_TPZVec<int>.fStore = local_1038.fPivot.fExtAlloc;
    local_1038.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
    local_1038.fPivot.super_TPZVec<int>.fNElements = 0;
    local_1038.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_1038.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
    local_1038.fWork.fStore = (double *)0x0;
    local_1038.fWork.fNElements = 0;
    local_1038.fWork.fNAlloc = 0;
    local_1038.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFNMatrix_018860b0;
    lVar7 = 0;
    do {
      if (((data->fPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <=
           lVar7) ||
         ((data->fPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1
         )) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if ((local_1160.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar7) ||
         (local_1160.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      local_1160.fElem[lVar7] = (data->fPhi).super_TPZFMatrix<double>.fElem[lVar7];
      lVar9 = 0;
      bVar2 = true;
      do {
        bVar6 = bVar2;
        lVar8 = (data->fDPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
                fRow;
        if ((lVar8 <= lVar9) ||
           ((data->fDPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol
            <= lVar7)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if ((local_1038.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar9) ||
           (local_1038.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar7)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        local_1038.fElem
        [local_1038.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar7 + lVar9] =
             (data->fDPhi).super_TPZFMatrix<double>.fElem[lVar8 * lVar7 + lVar9];
        lVar9 = 1;
        bVar2 = false;
      } while (bVar6);
      lVar7 = lVar7 + 1;
    } while (lVar7 != 4);
    pzshape::TPZShapeQuad::ShapeGenerating(pt,&local_1160,&local_1038);
    uVar11 = 4;
    lVar7 = 4;
    do {
      side = (int)lVar7;
      uVar3 = pzshape::TPZShapeQuad::NConnectShapeF
                        (side,(data->fH1ConnectOrders).super_TPZVec<int>.fStore[lVar7 + -4]);
      if (uVar3 != 0) {
        if ((local_1160.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar7) ||
           (local_1160.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        iVar4 = (int)uVar11;
        lVar9 = (long)iVar4;
        if (((iVar4 < 0) ||
            ((data->fPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow
             <= lVar9)) ||
           ((data->fPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <
            1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        (data->fPhi).super_TPZFMatrix<double>.fElem[lVar9] = local_1160.fElem[lVar7];
        lVar8 = 0;
        bVar2 = true;
        do {
          bVar6 = bVar2;
          if ((local_1038.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar8) ||
             (local_1038.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar7)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          lVar1 = (data->fDPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix
                  .fRow;
          if (((lVar1 <= lVar8) || (iVar4 < 0)) ||
             ((data->fDPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
              fCol <= lVar9)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          (data->fDPhi).super_TPZFMatrix<double>.fElem[lVar1 * lVar9 + lVar8] =
               local_1038.fElem
               [local_1038.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar7 + lVar8];
          lVar8 = 1;
          bVar2 = false;
        } while (bVar6);
        uVar10 = iVar4 + 1;
        uVar11 = (ulong)uVar10;
        if (uVar3 != 1) {
          this = (data->fSideTransforms).super_TPZVec<TPZTransform<double>_>.fStore + lVar7 + -4;
          iVar4 = pztopology::TPZQuadrilateral::SideDimension(side);
          lVar9 = (long)(int)uVar3;
          local_f10.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
          local_f10.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
          local_f10.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
          local_f10.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
               (_func_int **)&PTR__TPZFMatrix_018379e0;
          local_f10.fSize = 100;
          local_f10.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = lVar9;
          local_f10.fElem = adStack_e80;
          local_f10.fGiven = adStack_e80;
          TPZVec<int>::TPZVec(&local_f10.fPivot.super_TPZVec<int>,0);
          local_f10.fPivot.super_TPZVec<int>._vptr_TPZVec =
               (_func_int **)&PTR__TPZManVector_01815498;
          local_f10.fPivot.super_TPZVec<int>.fStore = local_f10.fPivot.fExtAlloc;
          local_f10.fPivot.super_TPZVec<int>.fNElements = 0;
          local_f10.fPivot.super_TPZVec<int>.fNAlloc = 0;
          local_f10.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
          local_f10.fWork.fStore = (double *)0x0;
          local_f10.fWork.fNElements = 0;
          local_f10.fWork.fNAlloc = 0;
          if (100 < (int)uVar3) {
            local_f10.fElem = (double *)operator_new__(lVar9 * 8);
          }
          local_f10.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
               (_func_int **)&PTR__TPZFNMatrix_018376f0;
          lVar8 = (long)iVar4;
          local_b58.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
          local_b58.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
          local_b58.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
               (_func_int **)&PTR__TPZFMatrix_018379e0;
          local_b58.fSize = 100;
          local_b58.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = lVar8;
          local_b58.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = lVar9;
          local_b58.fElem = adStack_ac8;
          local_b58.fGiven = adStack_ac8;
          TPZVec<int>::TPZVec(&local_b58.fPivot.super_TPZVec<int>,0);
          local_b58.fPivot.super_TPZVec<int>._vptr_TPZVec =
               (_func_int **)&PTR__TPZManVector_01815498;
          local_b58.fPivot.super_TPZVec<int>.fStore = local_b58.fPivot.fExtAlloc;
          local_b58.fPivot.super_TPZVec<int>.fNElements = 0;
          local_b58.fPivot.super_TPZVec<int>.fNAlloc = 0;
          local_b58.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
          local_b58.fWork.fStore = (double *)0x0;
          local_b58.fWork.fNElements = 0;
          local_b58.fWork.fNAlloc = 0;
          if (iVar4 == 0) {
            local_b58.fElem = (double *)0x0;
          }
          else {
            uVar5 = lVar8 * lVar9;
            if (100 < (long)uVar5) {
              local_b58.fElem = (double *)operator_new__(-(ulong)(uVar5 >> 0x3d != 0) | uVar5 * 8);
            }
          }
          local_b58.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
               (_func_int **)&PTR__TPZFNMatrix_018376f0;
          local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 2;
          local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
          local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
          local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
               (_func_int **)&PTR__TPZFMatrix_018379e0;
          local_7a0.fSize = 100;
          local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = lVar9;
          local_7a0.fElem = adStack_710;
          local_7a0.fGiven = adStack_710;
          TPZVec<int>::TPZVec(&local_7a0.fPivot.super_TPZVec<int>,0);
          local_7a0.fPivot.super_TPZVec<int>._vptr_TPZVec =
               (_func_int **)&PTR__TPZManVector_01815498;
          local_7a0.fPivot.super_TPZVec<int>.fStore = local_7a0.fPivot.fExtAlloc;
          local_7a0.fPivot.super_TPZVec<int>.fNElements = 0;
          local_7a0.fPivot.super_TPZVec<int>.fNAlloc = 0;
          local_7a0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
          local_7a0.fWork.fStore = (double *)0x0;
          local_7a0.fWork.fNElements = 0;
          local_7a0.fWork.fNAlloc = 0;
          if (0x32 < (int)uVar3) {
            local_7a0.fElem = (double *)operator_new__(lVar9 << 4);
          }
          local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
               (_func_int **)&PTR__TPZFNMatrix_018376f0;
          local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 2;
          local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
          local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
          local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
               (_func_int **)&PTR__TPZFMatrix_018379e0;
          local_3e8.fSize = 100;
          local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = lVar9;
          local_3e8.fElem = adStack_358;
          local_3e8.fGiven = adStack_358;
          TPZVec<int>::TPZVec(&local_3e8.fPivot.super_TPZVec<int>,0);
          local_3e8.fPivot.super_TPZVec<int>._vptr_TPZVec =
               (_func_int **)&PTR__TPZManVector_01815498;
          local_3e8.fPivot.super_TPZVec<int>.fStore = local_3e8.fPivot.fExtAlloc;
          local_3e8.fPivot.super_TPZVec<int>.fNElements = 0;
          local_3e8.fPivot.super_TPZVec<int>.fNAlloc = 0;
          local_3e8.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
          local_3e8.fWork.fStore = (double *)0x0;
          local_3e8.fWork.fNElements = 0;
          local_3e8.fWork.fNAlloc = 0;
          if (0x32 < (int)uVar3) {
            local_3e8.fElem = (double *)operator_new__(lVar9 << 4);
          }
          local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
               (_func_int **)&PTR__TPZFNMatrix_018376f0;
          TPZManVector<double,_3>::TPZManVector(&local_1198,lVar8);
          TPZTransform<double>::Apply(this,pt,&local_1198.super_TPZVec<double>);
          pzshape::TPZShapeQuad::ShapeInternal
                    (side,&local_1198.super_TPZVec<double>,
                     (data->fH1ConnectOrders).super_TPZVec<int>.fStore[lVar7 + -4],&local_f10,
                     &local_b58);
          if (iVar4 < 3) {
            local_1238.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 1;
            local_1238.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
            local_1238.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
            local_1238.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
            local_1238.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
                 = (_func_int **)&PTR__TPZFMatrix_018ba970;
            local_1238.fSize = 1;
            local_1238.fElem = adStack_11a8;
            local_1238.fGiven = adStack_11a8;
            TPZVec<int>::TPZVec(&local_1238.fPivot.super_TPZVec<int>,0);
            local_1238.fPivot.super_TPZVec<int>._vptr_TPZVec =
                 (_func_int **)&PTR__TPZManVector_01815498;
            local_1238.fPivot.super_TPZVec<int>.fStore = local_1238.fPivot.fExtAlloc;
            local_1238.fPivot.super_TPZVec<int>.fNElements = 0;
            local_1238.fPivot.super_TPZVec<int>.fNAlloc = 0;
            local_1238.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
            local_1238.fWork.fStore = (double *)0x0;
            local_1238.fWork.fNElements = 0;
            local_1238.fWork.fNAlloc = 0;
            local_1238.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
                 = (_func_int **)&PTR__TPZFNMatrix_018ba680;
            TPZFMatrix<double>::operator=(&local_1238,0.0);
            (*(this->fMult).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
              super_TPZSavable._vptr_TPZSavable[0x27])
                      (0x3ff0000000000000,0,&this->fMult,&local_b58,&local_1238,&local_7a0,1);
            if (1 < (int)uVar3) {
              uVar11 = (ulong)(int)uVar10;
              uVar5 = 1;
              do {
                if ((local_1160.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar7) ||
                   (local_1160.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                if ((local_f10.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar5) ||
                   (local_f10.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                if ((((long)uVar11 < 0) ||
                    ((data->fPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                     super_TPZBaseMatrix.fRow <= (long)uVar11)) ||
                   ((data->fPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                    super_TPZBaseMatrix.fCol < 1)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                (data->fPhi).super_TPZFMatrix<double>.fElem[uVar11] =
                     local_1160.fElem[lVar7] * local_f10.fElem[uVar5];
                lVar9 = 0;
                bVar2 = true;
                do {
                  bVar6 = bVar2;
                  if ((local_1038.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar9) ||
                     (local_1038.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar7)) {
                    TPZFMatrix<double>::Error
                              ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                    pzinternal::DebugStopImpl
                              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                               ,0x26d);
                  }
                  if ((local_f10.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar5) ||
                     (local_f10.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
                    TPZFMatrix<double>::Error
                              ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                    pzinternal::DebugStopImpl
                              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                               ,0x26d);
                  }
                  if ((local_1160.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar7) ||
                     (local_1160.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
                    TPZFMatrix<double>::Error
                              ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                    pzinternal::DebugStopImpl
                              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                               ,0x26d);
                  }
                  if ((local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar9) ||
                     (local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= (long)uVar5)) {
                    TPZFMatrix<double>::Error
                              ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                    pzinternal::DebugStopImpl
                              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                               ,0x26d);
                  }
                  lVar8 = (data->fDPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                          super_TPZBaseMatrix.fRow;
                  if (((lVar8 <= lVar9) || ((long)uVar11 < 0)) ||
                     ((data->fDPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                      super_TPZBaseMatrix.fCol <= (long)uVar11)) {
                    TPZFMatrix<double>::Error
                              ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                    pzinternal::DebugStopImpl
                              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                               ,0x26d);
                  }
                  (data->fDPhi).super_TPZFMatrix<double>.fElem[lVar8 * uVar11 + lVar9] =
                       local_1038.fElem
                       [local_1038.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar7 + lVar9]
                       * local_f10.fElem[uVar5] +
                       local_1160.fElem[lVar7] *
                       local_7a0.fElem
                       [local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * uVar5 + lVar9];
                  lVar9 = 1;
                  bVar2 = false;
                } while (bVar6);
                uVar11 = uVar11 + 1;
                uVar5 = uVar5 + 1;
              } while (uVar5 != uVar3);
            }
            TPZFMatrix<double>::~TPZFMatrix(&local_1238,&PTR_PTR_018ba938);
          }
          else if (1 < (int)uVar3) {
            uVar11 = (ulong)(int)uVar10;
            uVar5 = 1;
            do {
              if ((local_1160.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar7) ||
                 (local_1160.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              if ((local_f10.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar5) ||
                 (local_f10.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              if ((((long)uVar11 < 0) ||
                  ((data->fPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix
                   .fRow <= (long)uVar11)) ||
                 ((data->fPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
                  fCol < 1)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              (data->fPhi).super_TPZFMatrix<double>.fElem[uVar11] =
                   local_1160.fElem[lVar7] * local_f10.fElem[uVar5];
              lVar9 = 0;
              bVar2 = true;
              do {
                bVar6 = bVar2;
                if ((local_1038.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar9) ||
                   (local_1038.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar7)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                if ((local_f10.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar5) ||
                   (local_f10.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                if ((local_1160.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar7) ||
                   (local_1160.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                if ((local_b58.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar9) ||
                   (local_b58.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= (long)uVar5)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                lVar8 = (data->fDPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                        super_TPZBaseMatrix.fRow;
                if (((lVar8 <= lVar9) || ((long)uVar11 < 0)) ||
                   ((data->fDPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                    super_TPZBaseMatrix.fCol <= (long)uVar11)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                (data->fDPhi).super_TPZFMatrix<double>.fElem[lVar8 * uVar11 + lVar9] =
                     local_1038.fElem
                     [local_1038.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar7 + lVar9] *
                     local_f10.fElem[uVar5] +
                     local_1160.fElem[lVar7] *
                     local_b58.fElem
                     [local_b58.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * uVar5 + lVar9];
                lVar9 = 1;
                bVar2 = false;
              } while (bVar6);
              uVar11 = uVar11 + 1;
              uVar5 = uVar5 + 1;
            } while (uVar5 != uVar3);
          }
          TPZManVector<double,_3>::~TPZManVector(&local_1198);
          TPZFMatrix<double>::~TPZFMatrix(&local_3e8,&PTR_PTR_018379a8);
          TPZFMatrix<double>::~TPZFMatrix(&local_7a0,&PTR_PTR_018379a8);
          TPZFMatrix<double>::~TPZFMatrix(&local_b58,&PTR_PTR_018379a8);
          TPZFMatrix<double>::~TPZFMatrix(&local_f10,&PTR_PTR_018379a8);
        }
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != 9);
    TPZFMatrix<double>::~TPZFMatrix(&local_1038,&PTR_PTR_01886368);
    TPZFMatrix<double>::~TPZFMatrix(&local_1160,&PTR_PTR_01886368);
  }
  return;
}

Assistant:

void TPZShapeH1<TSHAPE>::Shape(const TPZVec<REAL> &pt, TPZShapeData &data) {

    
//    TPZVec<REAL> &pt = par.pt;
//    TPZFMatrix<REAL> &phi = par.phi;
//    TPZFMatrix<REAL> &dphi = par.dphi;
    
    TSHAPE::ShapeCorner(pt,data.fPhi,data.fDPhi);
    
    if(data.fPhi.Rows() == TSHAPE::NCornerNodes) return;
    
    const int dim = TSHAPE::Dimension;
    const int NSides = TSHAPE::NSides;
    const int NCorners = TSHAPE::NCornerNodes;

    TPZFNMatrix<NSides*dim,REAL> phiblend(NSides,1),dphiblend(dim,NSides);
    for(int nod=0; nod<NCorners; nod++)
    {
        phiblend(nod,0) = data.fPhi(nod,0);
        for(int d=0; d< dim; d++)
        {
            dphiblend(d,nod) = data.fDPhi(d,nod);
        }
    }
    TSHAPE::ShapeGenerating(pt, phiblend, dphiblend);
    int shape = NCorners;
    for (int side = NCorners; side<NSides ; side++)
    {
        int numshape = TSHAPE::NConnectShapeF(side, data.fH1ConnectOrders[side-NCorners]);
        if(numshape == 0) continue;
        
        data.fPhi(shape,0) = phiblend(side,0);
        for(int d=0; d<dim; d++) data.fDPhi(d,shape) = dphiblend(d,side);
        shape++;
        
        if(numshape == 1) continue;
        
        TPZTransform<REAL> &transform = data.fSideTransforms[side - NCorners];
        int sidedim = TSHAPE::SideDimension(side);
        TPZFNMatrix<100,REAL> phin(numshape,1), dphin(sidedim,numshape), dphiaux(TSHAPE::Dimension,numshape),
            dphiaux2(TSHAPE::Dimension,numshape);
        TPZManVector<REAL,3> outvec(sidedim);
        transform.Apply(pt, outvec);
//        dphin.Zero();
        TSHAPE::ShapeInternal(side, outvec,data.fH1ConnectOrders[side - NCorners], phin, dphin);
        if(sidedim < 3)
        {
            constexpr REAL alpha = 1.;
            constexpr REAL beta = 0.;
            constexpr int opt = 1;
            TPZFNMatrix<1,REAL> auxmat(1,1,0);    
            TPZFMatrix<REAL> &mult = transform.Mult();
            mult.MultAdd(dphin, auxmat, dphiaux,alpha,beta,opt);
            
            for (int i = 1; i < numshape; i++) {
                data.fPhi(shape,0) = phiblend(side,0)*phin(i,0);
                for(int xj=0;xj<TSHAPE::Dimension;xj++) {
                    data.fDPhi(xj,shape) = dphiblend(xj,side)*phin(i,0)+phiblend(side,0)*dphiaux(xj,i);
                }
                shape++;
            }
        } else
        {
            for (int i = 1; i < numshape; i++) {
                data.fPhi(shape,0) = phiblend(side,0)*phin(i,0);
                for(int xj=0;xj<TSHAPE::Dimension;xj++) {
                    data.fDPhi(xj,shape) = dphiblend(xj,side)*phin(i,0)+phiblend(side,0)*dphin(xj,i);
                }
                shape++;
            }

        }
    }
    
}